

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::register_application_link_hash
          (Impl *this,ResourceTag tag,Hash hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob)

{
  DatabaseInterface *pDVar1;
  bool bVar2;
  uint uVar3;
  Hash hash_00;
  uchar *puVar4;
  size_type sVar5;
  Hash link_hash;
  PayloadWriteFlags payload_flags;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *blob_local;
  Hash hash_local;
  ResourceTag tag_local;
  Impl *this_local;
  
  if ((this->application_feature_links & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    link_hash._4_4_ = 0;
    if ((this->checksum & 1U) != 0) {
      link_hash._4_4_ = 8;
    }
    hash_00 = get_application_link_hash(this,tag,hash);
    register_on_use(this,RESOURCE_APPLICATION_BLOB_LINK,hash_00);
    uVar3 = (*this->database_iface->_vptr_DatabaseInterface[5])(this->database_iface,8,hash_00);
    if ((uVar3 & 1) == 0) {
      bVar2 = serialize_application_blob_link(this,hash,tag,blob);
      if (bVar2) {
        pDVar1 = this->database_iface;
        puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(blob);
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(blob);
        (*pDVar1->_vptr_DatabaseInterface[4])(pDVar1,8,hash_00,puVar4,sVar5,(ulong)link_hash._4_4_);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::register_application_link_hash(ResourceTag tag, Hash hash, vector<uint8_t> &blob) const
{
	if (!application_feature_links)
		return false;

	PayloadWriteFlags payload_flags = 0;
	if (checksum)
		payload_flags |= PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT;

	Hash link_hash = get_application_link_hash(tag, hash);
	register_on_use(RESOURCE_APPLICATION_BLOB_LINK, link_hash);
	if (!database_iface->has_entry(RESOURCE_APPLICATION_BLOB_LINK, link_hash))
	{
		if (!serialize_application_blob_link(hash, tag, blob))
			return false;
		database_iface->write_entry(RESOURCE_APPLICATION_BLOB_LINK, link_hash, blob.data(), blob.size(), payload_flags);
		return true;
	}
	else
		return false;
}